

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O1

void test_sparse_basic(void)

{
  wchar_t wVar1;
  int iVar2;
  archive_entry *entry;
  char *pcVar3;
  archive *paVar4;
  char *path;
  int iVar5;
  long lVar6;
  
  entry = archive_entry_new();
  lVar6 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ǧ',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_size(entry,0x2800);
  do {
    archive_entry_sparse_add_entry(entry,lVar6,0x400);
    lVar6 = lVar6 + 0x400;
  } while ((int)lVar6 != 0x2800);
  failure("There should be no sparse");
  wVar1 = archive_entry_sparse_count(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ǵ',0,"0",(long)wVar1,"archive_entry_sparse_count(ae)",(void *)0x0);
  archive_entry_free(entry);
  pcVar3 = getenv("SKIP_TEST_SPARSE");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getcwd((char *)0x0,0);
    path = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
    ;
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                             ,L'ɏ',(uint)(pcVar3 != (char *)0x0),"cwd != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      return;
    }
    iVar2 = is_sparse_supported(path);
    if (iVar2 != 0) {
      paVar4 = archive_read_disk_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ɜ',(uint)(paVar4 != (archive *)0x0),
                       "(a = archive_read_disk_new()) != NULL",(void *)0x0);
      verify_sparse_file(paVar4,"file0",(sparse *)&DAT_002bb490,4);
      verify_sparse_file(paVar4,"file1",(sparse *)&DAT_002bb530,3);
      verify_sparse_file(paVar4,"file2",(sparse *)&DAT_002bb590,0x14);
      verify_sparse_file(paVar4,"file3",(sparse *)&DAT_002bb820,0);
      verify_sparse_file(paVar4,"file4",(sparse *)&DAT_002bb890,2);
      iVar2 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ɥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      paVar4 = archive_read_disk_new();
      iVar2 = 0x29c400;
      iVar5 = 0;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ɪ',(uint)(paVar4 != (archive *)0x0),
                       "(a = archive_read_disk_new()) != NULL",(void *)0x0);
      verify_sparse_file2(paVar4,(char *)0x5,(sparse *)0x0,iVar2,iVar5);
      verify_sparse_file2(paVar4,(char *)0x5,(sparse *)0x1,iVar2,iVar5);
      iVar2 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ɯ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      paVar4 = archive_read_disk_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ɵ',(uint)(paVar4 != (archive *)0x0),
                       "(a = archive_read_disk_new()) != NULL",(void *)0x0);
      wVar1 = archive_read_disk_set_behavior(paVar4,L'\x80');
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ɸ',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_read_disk_set_behavior(a, ARCHIVE_READDISK_NO_SPARSE)",paVar4);
      verify_sparse_file(paVar4,"file0",(sparse *)&DAT_002bb490,0);
      verify_sparse_file(paVar4,"file1",(sparse *)&DAT_002bb530,0);
      verify_sparse_file(paVar4,"file2",(sparse *)&DAT_002bb590,0);
      verify_sparse_file(paVar4,"file3",(sparse *)&DAT_002bb820,0);
      verify_sparse_file(paVar4,"file4",(sparse *)&DAT_002bb890,0);
      iVar2 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ʀ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      paVar4 = archive_read_disk_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ʂ',(uint)(paVar4 != (archive *)0x0),
                       "(a = archive_read_disk_new()) != NULL",(void *)0x0);
      wVar1 = archive_read_disk_set_behavior(paVar4,L'\x80');
      lVar6 = (long)wVar1;
      iVar2 = 0x2b631c;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ʅ',0,"ARCHIVE_OK",lVar6,
                          "archive_read_disk_set_behavior(a, ARCHIVE_READDISK_NO_SPARSE)",paVar4);
      iVar5 = (int)lVar6;
      verify_sparse_file2(paVar4,(char *)0x0,(sparse *)0x0,iVar2,iVar5);
      verify_sparse_file2(paVar4,(char *)0x0,(sparse *)0x1,iVar2,iVar5);
      iVar2 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ʊ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      free(pcVar3);
      return;
    }
    free(pcVar3);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ɓ');
    pcVar3 = 
    "This filesystem or platform do not support the reporting of the holes of a sparse file through API such as lseek(HOLE)"
    ;
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'Ƀ');
    pcVar3 = "Skipping sparse tests due to SKIP_TEST_SPARSE environment variable";
  }
  test_skipping(pcVar3);
  return;
}

Assistant:

static void
test_sparse_whole_file_data(void)
{
	struct archive_entry *ae;
	int64_t offset;
	int i;

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_size(ae, 1024*10);

	/*
	 * Add sparse block data up to the file size.
	 */
	offset = 0;
	for (i = 0; i < 10; i++) {
		archive_entry_sparse_add_entry(ae, offset, 1024);
		offset += 1024;
	}

	failure("There should be no sparse");
	assertEqualInt(0, archive_entry_sparse_count(ae));
	archive_entry_free(ae);
}